

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

bool __thiscall
cmGeneratorTarget::ComputePDBOutputDir
          (cmGeneratorTarget *this,string *kind,string *config,string *out)

{
  size_type sVar1;
  cmGlobalGenerator *pcVar2;
  bool bVar3;
  char *pcVar4;
  string *in_base;
  char *pcVar5;
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_> cge
  ;
  cmGeneratorExpression ge;
  string conf;
  string configPropStr;
  string propertyNameStr;
  string configUpper;
  undefined1 local_128 [16];
  string local_118;
  cmGeneratorExpression local_f8 [2];
  string local_d8;
  char *local_b8;
  long local_b0;
  cmListFileBacktrace local_98;
  cmListFileBacktrace local_88;
  char *local_70;
  long local_68;
  string local_50;
  
  std::__cxx11::string::string((string *)&local_70,(string *)kind);
  if (local_68 == 0) {
    pcVar5 = (char *)0x0;
  }
  else {
    std::__cxx11::string::append((char *)&local_70);
    pcVar5 = local_70;
  }
  std::__cxx11::string::string((string *)&local_d8,(string *)config);
  cmsys::SystemTools::UpperCase(&local_50,&local_d8);
  std::__cxx11::string::string((string *)&local_b8,(string *)kind);
  if (local_b0 == 0) {
    local_b8 = (char *)0x0;
  }
  else {
    std::__cxx11::string::append((char *)&local_b8);
    std::__cxx11::string::append((string *)&local_b8);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_118,local_b8,(allocator<char> *)local_f8);
  pcVar4 = GetProperty(this,&local_118);
  std::__cxx11::string::~string((string *)&local_118);
  if (pcVar4 == (char *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_118,pcVar5,(allocator<char> *)local_f8);
    pcVar5 = GetProperty(this,&local_118);
    std::__cxx11::string::~string((string *)&local_118);
    if (pcVar5 == (char *)0x0) goto LAB_002b3f54;
    local_98.TopEntry.
    super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_98.TopEntry.
    super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    cmGeneratorExpression::cmGeneratorExpression(local_f8,&local_98);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_98.TopEntry.
                super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    cmGeneratorExpression::Parse((cmGeneratorExpression *)local_128,(char *)local_f8);
    local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
    local_118._M_string_length = 0;
    local_118.field_2._M_local_buf[0] = '\0';
    cmCompiledGeneratorExpression::Evaluate
              ((cmCompiledGeneratorExpression *)local_128._0_8_,this->LocalGenerator,config,false,
               (cmGeneratorTarget *)0x0,(cmGeneratorTarget *)0x0,
               (cmGeneratorExpressionDAGChecker *)0x0,&local_118);
    std::__cxx11::string::_M_assign((string *)out);
    std::__cxx11::string::~string((string *)&local_118);
    bVar3 = std::operator!=(out,pcVar5);
    if (bVar3) goto LAB_002b3f32;
  }
  else {
    local_88.TopEntry.
    super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_88.TopEntry.
    super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    cmGeneratorExpression::cmGeneratorExpression(local_f8,&local_88);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_88.TopEntry.
                super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    cmGeneratorExpression::Parse((cmGeneratorExpression *)local_128,(char *)local_f8);
    local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
    local_118._M_string_length = 0;
    local_118.field_2._M_local_buf[0] = '\0';
    cmCompiledGeneratorExpression::Evaluate
              ((cmCompiledGeneratorExpression *)local_128._0_8_,this->LocalGenerator,config,false,
               (cmGeneratorTarget *)0x0,(cmGeneratorTarget *)0x0,
               (cmGeneratorExpressionDAGChecker *)0x0,&local_118);
    std::__cxx11::string::_M_assign((string *)out);
    std::__cxx11::string::~string((string *)&local_118);
LAB_002b3f32:
    local_d8._M_string_length = 0;
    *local_d8._M_dataplus._M_p = '\0';
  }
  std::
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>::
  ~unique_ptr((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
               *)local_128);
  cmGeneratorExpression::~cmGeneratorExpression(local_f8);
LAB_002b3f54:
  sVar1 = out->_M_string_length;
  if (sVar1 != 0) {
    in_base = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(this->LocalGenerator);
    cmsys::SystemTools::CollapseFullPath(&local_118,out,in_base);
    std::__cxx11::string::operator=((string *)out,(string *)&local_118);
    std::__cxx11::string::~string((string *)&local_118);
    if (local_d8._M_string_length != 0) {
      pcVar2 = this->LocalGenerator->GlobalGenerator;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_118,"/",(allocator<char> *)local_128);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_f8,"",(allocator<char> *)(local_128 + 0xf));
      (*pcVar2->_vptr_cmGlobalGenerator[0x16])(pcVar2,&local_118,&local_d8,local_f8,out);
      std::__cxx11::string::~string((string *)local_f8);
      std::__cxx11::string::~string((string *)&local_118);
    }
  }
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_70);
  return sVar1 != 0;
}

Assistant:

bool cmGeneratorTarget::ComputePDBOutputDir(const std::string& kind,
                                            const std::string& config,
                                            std::string& out) const
{
  // Look for a target property defining the target output directory
  // based on the target type.
  const char* propertyName = nullptr;
  std::string propertyNameStr = kind;
  if (!propertyNameStr.empty()) {
    propertyNameStr += "_OUTPUT_DIRECTORY";
    propertyName = propertyNameStr.c_str();
  }
  std::string conf = config;

  // Check for a per-configuration output directory target property.
  std::string configUpper = cmSystemTools::UpperCase(conf);
  const char* configProp = nullptr;
  std::string configPropStr = kind;
  if (!configPropStr.empty()) {
    configPropStr += "_OUTPUT_DIRECTORY_";
    configPropStr += configUpper;
    configProp = configPropStr.c_str();
  }

  // Select an output directory.
  if (const char* config_outdir = this->GetProperty(configProp)) {
    // Use the user-specified per-configuration output directory.
    cmGeneratorExpression ge;
    std::unique_ptr<cmCompiledGeneratorExpression> cge =
      ge.Parse(config_outdir);
    out = cge->Evaluate(this->LocalGenerator, config);

    // Skip per-configuration subdirectory.
    conf.clear();
  } else if (const char* outdir = this->GetProperty(propertyName)) {
    // Use the user-specified output directory.
    cmGeneratorExpression ge;
    std::unique_ptr<cmCompiledGeneratorExpression> cge = ge.Parse(outdir);
    out = cge->Evaluate(this->LocalGenerator, config);

    // Skip per-configuration subdirectory if the value contained a
    // generator expression.
    if (out != outdir) {
      conf.clear();
    }
  }
  if (out.empty()) {
    return false;
  }

  // Convert the output path to a full path in case it is
  // specified as a relative path.  Treat a relative path as
  // relative to the current output directory for this makefile.
  out = (cmSystemTools::CollapseFullPath(
    out, this->LocalGenerator->GetCurrentBinaryDirectory()));

  // The generator may add the configuration's subdirectory.
  if (!conf.empty()) {
    this->LocalGenerator->GetGlobalGenerator()->AppendDirectoryForConfig(
      "/", conf, "", out);
  }
  return true;
}